

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O1

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          BigInt<unsigned_int,_unsigned_long> *x)

{
  BigInt<unsigned_int,_unsigned_long> local_30;
  
  operator*(&local_30,x,&this->_q);
  BigInt<unsigned_int,_unsigned_long>::operator+=(&this->_p,&local_30);
  if (local_30._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _simplify(this);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator+=(const TValue& x)
	{
		_p += x * _q;
		_simplify();
		return *this;
	}